

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMSlicer.h
# Opt level: O0

void dg::llvmdg::LLVMSlicer::adjustBBlocksSucessors(LLVMDependenceGraph *graph,uint32_t slice_id)

{
  BBlock<dg::LLVMNode> *this;
  bool bVar1;
  uint32_t uVar2;
  uint uVar3;
  reference ppVar4;
  size_t sVar5;
  LLVMNode *pLVar6;
  reference pBVar7;
  pointer pBVar8;
  uint32_t in_ESI;
  DependenceGraph<dg::LLVMNode> *in_RDI;
  LLVMBBlock *succ_1;
  uint i;
  BBlockEdge *succ;
  iterator __end3;
  iterator __begin3;
  SuccContainerT *__range3;
  DGContainer<unsigned_char,_8U> labels;
  BBlockEdge edge;
  bool found;
  LLVMBBlock *BB;
  Instruction *tinst;
  BasicBlock *llvmBB;
  pair<llvm::Value_*const,_dg::BBlock<dg::LLVMNode>_*> *it;
  iterator __end2;
  iterator __begin2;
  BBlocksMapT *__range2;
  LLVMBBlock *newExitBB;
  LLVMBBlock *oldExitBB;
  undefined7 in_stack_ffffffffffffff08;
  uchar in_stack_ffffffffffffff0f;
  BBlock<dg::LLVMNode> *in_stack_ffffffffffffff10;
  iterator in_stack_ffffffffffffff20;
  BBlock<dg::LLVMNode> *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  uint in_stack_ffffffffffffff34;
  uint uVar9;
  BBlock<dg::LLVMNode> *in_stack_ffffffffffffff38;
  _Self local_c0;
  _Self local_b8;
  SuccContainerT *local_b0;
  BBlock<dg::LLVMNode> *in_stack_ffffffffffffff78;
  BBlock<dg::LLVMNode> *in_stack_ffffffffffffff80;
  _Self local_38;
  _Self local_30;
  BBlocksMapT *local_28;
  LLVMBBlock *local_20;
  BBlock<dg::LLVMNode> *local_18;
  uint32_t local_c;
  DependenceGraph<dg::LLVMNode> *local_8;
  
  local_c = in_ESI;
  local_8 = in_RDI;
  local_18 = DependenceGraph<dg::LLVMNode>::getExitBB(in_RDI);
  local_20 = (LLVMBBlock *)0x0;
  local_28 = DependenceGraph<dg::LLVMNode>::getBlocks(local_8);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<llvm::Value_*,_dg::BBlock<dg::LLVMNode>_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::BBlock<dg::LLVMNode>_*>_>_>
       ::begin((map<llvm::Value_*,_dg::BBlock<dg::LLVMNode>_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::BBlock<dg::LLVMNode>_*>_>_>
                *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
  local_38._M_node =
       (_Base_ptr)
       std::
       map<llvm::Value_*,_dg::BBlock<dg::LLVMNode>_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::BBlock<dg::LLVMNode>_*>_>_>
       ::end((map<llvm::Value_*,_dg::BBlock<dg::LLVMNode>_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::BBlock<dg::LLVMNode>_*>_>_>
              *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
  do {
    bVar1 = std::operator!=(&local_30,&local_38);
    if (!bVar1) {
      if (local_20 != (BBlock<dg::LLVMNode> *)0x0) {
        BBlock<dg::LLVMNode>::getKey(local_20);
        DependenceGraph<dg::LLVMNode>::addBlock
                  ((DependenceGraph<dg::LLVMNode> *)
                   CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                   (KeyT)in_stack_ffffffffffffff28,
                   (BBlock<dg::LLVMNode> *)in_stack_ffffffffffffff20._M_node);
      }
      return;
    }
    ppVar4 = std::_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::BBlock<dg::LLVMNode>_*>_>::
             operator*((_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::BBlock<dg::LLVMNode>_*>_>
                        *)0x1ae0b1);
    llvm::cast<llvm::BasicBlock,llvm::Value>((Value *)0x1ae0c9);
    llvm::BasicBlock::getTerminator();
    this = ppVar4->second;
    sVar5 = BBlock<dg::LLVMNode>::successorsNum((BBlock<dg::LLVMNode> *)0x1ae107);
    if (sVar5 != 0) {
      sVar5 = BBlock<dg::LLVMNode>::successorsNum((BBlock<dg::LLVMNode> *)0x1ae11f);
      if (sVar5 == 2) {
        pLVar6 = BBlock<dg::LLVMNode>::getLastNode
                           ((BBlock<dg::LLVMNode> *)
                            CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
        uVar2 = Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::getSlice
                          (&pLVar6->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>
                          );
        if ((((uVar2 != local_c) &&
             (bVar1 = BBlock<dg::LLVMNode>::successorsAreSame(in_stack_ffffffffffffff38), !bVar1))
            && (bVar1 = BBlock<dg::LLVMNode>::hasSuccessor
                                  (in_stack_ffffffffffffff10,
                                   (BBlock<dg::LLVMNode> *)
                                   CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08)),
               bVar1)) &&
           (uVar9 = BBlock<dg::LLVMNode>::removeSuccessorsTarget
                              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78), uVar9 == 0)) {
          abort();
        }
      }
      sVar5 = BBlock<dg::LLVMNode>::successorsNum((BBlock<dg::LLVMNode> *)0x1ae1b1);
      if (sVar5 == 1) {
        pLVar6 = BBlock<dg::LLVMNode>::getLastNode
                           ((BBlock<dg::LLVMNode> *)
                            CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
        uVar2 = Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::getSlice
                          (&pLVar6->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>
                          );
        if (uVar2 != local_c) {
          BBlock<dg::LLVMNode>::successors(this);
          DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U>::begin
                    ((DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U> *)
                     CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
          pBVar7 = std::_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>::BBlockEdge>::operator*
                             ((_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>::BBlockEdge> *)
                              0x1ae207);
          if ((pBVar7->target == local_18) && (local_20 == (LLVMBBlock *)0x0)) {
            local_20 = addNewExitBB((LLVMDependenceGraph *)in_stack_ffffffffffffff10);
          }
          BBlock<dg::LLVMNode>::removeSuccessors
                    ((BBlock<dg::LLVMNode> *)
                     CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
          BBlock<dg::LLVMNode>::addSuccessor
                    ((BBlock<dg::LLVMNode> *)
                     CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                     (BBlockEdge *)in_stack_ffffffffffffff28);
          goto LAB_001ae454;
        }
      }
      DGContainer<unsigned_char,_8U>::DGContainer((DGContainer<unsigned_char,_8U> *)0x1ae299);
      local_b0 = BBlock<dg::LLVMNode>::successors(this);
      local_b8._M_node =
           (_Base_ptr)
           DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U>::begin
                     ((DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U> *)
                      CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
      local_c0._M_node =
           (_Base_ptr)
           DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U>::end
                     ((DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U> *)
                      CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
      while (bVar1 = std::operator!=(&local_b8,&local_c0), bVar1) {
        in_stack_ffffffffffffff38 =
             (BBlock<dg::LLVMNode> *)
             std::_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>::BBlockEdge>::operator*
                       ((_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>::BBlockEdge> *)0x1ae2e8);
        if ((*(BBlockLabelTy *)&in_stack_ffffffffffffff38->dg != 0xff) &&
           ((BBlock<dg::LLVMNode> *)in_stack_ffffffffffffff38->key != local_18)) {
          DGContainer<unsigned_char,_8U>::insert
                    ((DGContainer<unsigned_char,_8U> *)
                     CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                     (uchar)((ulong)in_stack_ffffffffffffff28 >> 0x38));
        }
        std::_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>::BBlockEdge>::operator++
                  ((_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>::BBlockEdge> *)
                   in_stack_ffffffffffffff10);
      }
      uVar9 = 0;
      while (in_stack_ffffffffffffff34 = uVar9, uVar3 = llvm::Instruction::getNumSuccessors(),
            uVar9 < uVar3) {
        bVar1 = DGContainer<unsigned_char,_8U>::contains
                          ((DGContainer<unsigned_char,_8U> *)in_stack_ffffffffffffff10,
                           in_stack_ffffffffffffff0f);
        if (!bVar1) {
          if (local_20 == (LLVMBBlock *)0x0) {
            local_20 = addNewExitBB((LLVMDependenceGraph *)in_stack_ffffffffffffff10);
          }
          BBlock<dg::LLVMNode>::addSuccessor
                    ((BBlock<dg::LLVMNode> *)
                     CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                     in_stack_ffffffffffffff28,
                     (uint8_t)((ulong)in_stack_ffffffffffffff20._M_node >> 0x38));
        }
        uVar9 = in_stack_ffffffffffffff34 + 1;
      }
      if (local_20 != (LLVMBBlock *)0x0) {
        BBlock<dg::LLVMNode>::removeSuccessorsTarget
                  (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      }
      sVar5 = BBlock<dg::LLVMNode>::successorsNum((BBlock<dg::LLVMNode> *)0x1ae3e4);
      if ((1 < sVar5) &&
         (bVar1 = BBlock<dg::LLVMNode>::successorsAreSame(in_stack_ffffffffffffff38), bVar1)) {
        BBlock<dg::LLVMNode>::successors(this);
        in_stack_ffffffffffffff20 =
             DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U>::begin
                       ((DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U> *)
                        CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
        pBVar8 = std::_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>::BBlockEdge>::operator->
                           ((_Rb_tree_const_iterator<dg::BBlock<dg::LLVMNode>::BBlockEdge> *)
                            0x1ae421);
        in_stack_ffffffffffffff28 = pBVar8->target;
        BBlock<dg::LLVMNode>::removeSuccessors
                  ((BBlock<dg::LLVMNode> *)
                   CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
        BBlock<dg::LLVMNode>::addSuccessor
                  ((BBlock<dg::LLVMNode> *)
                   CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                   in_stack_ffffffffffffff28,
                   (uint8_t)((ulong)in_stack_ffffffffffffff20._M_node >> 0x38));
      }
      DGContainer<unsigned_char,_8U>::~DGContainer((DGContainer<unsigned_char,_8U> *)0x1ae454);
    }
LAB_001ae454:
    std::_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::BBlock<dg::LLVMNode>_*>_>::operator++
              ((_Rb_tree_iterator<std::pair<llvm::Value_*const,_dg::BBlock<dg::LLVMNode>_*>_> *)
               in_stack_ffffffffffffff10);
  } while( true );
}

Assistant:

static void adjustBBlocksSucessors(LLVMDependenceGraph *graph,
                                       uint32_t slice_id) {
        LLVMBBlock *oldExitBB = graph->getExitBB();
        assert(oldExitBB && "Don't have exit BB");

        LLVMBBlock *newExitBB = nullptr;

        for (auto &it : graph->getBlocks()) {
            const llvm::BasicBlock *llvmBB =
                    llvm::cast<llvm::BasicBlock>(it.first);
            const auto *const tinst = llvmBB->getTerminator();
            LLVMBBlock *BB = it.second;

            // nothing to do
            if (BB->successorsNum() == 0)
                continue;

            // if the BB has two successors and one is self-loop and
            // the branch inst is going to be removed, then the brach
            // that created the self-loop has no meaning to the sliced
            // program and this is going to be an unconditional jump
            // to the other branch
            // NOTE: do this before the next action, to rename the label if
            // needed
            if (BB->successorsNum() == 2 &&
                BB->getLastNode()->getSlice() != slice_id &&
                !BB->successorsAreSame() && BB->hasSuccessor(BB)) {
                bool found = BB->removeSuccessorsTarget(BB);
                // we have two different successors, none of them
                // is self-loop and we're slicing away the brach inst?
                // This should not happen...
                if (!found) {
                    assert(found && "Self loop did not have self loop...");
                    abort();
                }
                assert(BB->successorsNum() == 1 &&
                       "Should have only one successor");

                // continue here to rename the only label if needed
            }

            // if the BB has only one successor and the terminator
            // instruction is going to be sliced away, it means that
            // this is going to be an unconditional jump,
            // so just make the label 0
            if (BB->successorsNum() == 1 &&
                BB->getLastNode()->getSlice() != slice_id) {
                auto edge = *(BB->successors().begin());

                // modify the edge
                edge.label = 0;
                if (edge.target == oldExitBB) {
                    if (!newExitBB)
                        newExitBB = addNewExitBB(graph);

                    edge.target = newExitBB;
                }

                // replace the only edge
                BB->removeSuccessors();
                BB->addSuccessor(edge);

                continue;
            }

            // when we have more successors, we need to fill in
            // jumps under labels that we sliced away

            DGContainer<uint8_t> labels;
            // go through BBs successors and gather all labels
            // from edges that go from this BB. Also if there's
            // a jump to return block, replace it with new
            // return block
            for (const auto &succ : BB->successors()) {
                // skip artificial return basic block.
                if (succ.label == LLVMBBlock::ARTIFICIAL_BBLOCK_LABEL ||
                    succ.target == oldExitBB)
                    continue;

                labels.insert(succ.label);
            }

            // replace missing labels. Label should be from 0 to some max,
            // no gaps, so jump to safe exit under missing labels
            for (unsigned i = 0; i < tinst->getNumSuccessors(); ++i) {
                if (!labels.contains(i)) {
                    if (!newExitBB)
                        newExitBB = addNewExitBB(graph);

#ifndef NDEBUG
                    bool ret =
#endif
                            BB->addSuccessor(newExitBB, i);
                    assert(ret && "Already had this CFG edge, that is wrong");
                }
            }

            // this BB is going to be removed
            if (newExitBB)
                BB->removeSuccessorsTarget(oldExitBB);

            // if we have all successor edges pointing to the same
            // block, replace them with one successor (thus making
            // unconditional jump)
            if (BB->successorsNum() > 1 && BB->successorsAreSame()) {
                LLVMBBlock *succ = BB->successors().begin()->target;

                BB->removeSuccessors();
                BB->addSuccessor(succ, 0);
#ifdef NDEBUG
                assert(BB->successorsNum() == 1 &&
                       "BUG: in removeSuccessors() or addSuccessor()");
#endif
            }

#ifndef NDEBUG
            // check the BB
            labels.clear();
            for (const auto &succ : BB->successors()) {
                assert((!newExitBB || succ.target != oldExitBB) &&
                       "A block has the old BB as successor");
                // we can have more labels with different targets,
                // but we can not have one target with more labels
                assert(labels.insert(succ.label) && "Already have a label");
            }

            // check that we have all labels without any gep
            auto l = labels.begin();
            for (unsigned i = 0; i < labels.size(); ++i) {
                // set is ordered, so this must hold
                assert((*l == LLVMBBlock::MAX_BBLOCK_LABEL || i == *l++) &&
                       "Labels have a gap");
            }
#endif
        }

        if (newExitBB) {
            graph->addBlock(newExitBB->getKey(), newExitBB);
            assert(graph->getExitBB() == newExitBB);
            // NOTE: do not delete the old block
            // because it is the unified BB that is kept in
            // unique_ptr, so it will be deleted later automatically.
            // Deleting it would lead to double-free
        }
    }